

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O2

int Ivy_ManIsAcyclic_rec(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *__format;
  Ivy_Obj_t *pIVar4;
  
  iVar2 = p->nTravIds;
  iVar3 = 1;
  if (pObj->TravId == iVar2 + -1) {
    return 1;
  }
  if (pObj->TravId == iVar2) {
    fwrite("Manager contains combinational loop!\n",0x25,1,_stdout);
    fprintf(_stdout,"Node \"%d\" is encountered twice on the following path:\n",
            (ulong)(uint)pObj->Id);
    uVar1 = pObj->Id;
    __format = " %d";
LAB_00642314:
    iVar3 = 0;
    fprintf(_stdout,__format,(ulong)uVar1);
  }
  else {
    pObj->TravId = iVar2;
    if (((p->pHaig == (Ivy_Man_t *)0x0) && (pIVar4 = pObj->pEquiv, pIVar4 != (Ivy_Obj_t *)0x0)) &&
       (0 < pObj->nRefs)) {
      if (((ulong)pIVar4 & 1) != 0) {
        __assert_fail("!Ivy_IsComplement(pObj->pEquiv)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                      ,0x139,"int Ivy_ManIsAcyclic_rec(Ivy_Man_t *, Ivy_Obj_t *)");
      }
      for (; pIVar4 != pObj; pIVar4 = (Ivy_Obj_t *)((ulong)pIVar4->pEquiv & 0xfffffffffffffffe)) {
        iVar2 = Ivy_ManIsAcyclic_rec(p,pIVar4);
        if (iVar2 == 0) {
          fprintf(_stdout," -> (%d",(ulong)(uint)pObj->Id);
          for (pIVar4 = pObj->pEquiv; pIVar4 != pObj;
              pIVar4 = (Ivy_Obj_t *)((ulong)pIVar4->pEquiv & 0xfffffffffffffffe)) {
            fprintf(_stdout," %d",(ulong)(uint)pIVar4->Id);
          }
          fputc(0x29,_stdout);
          return 0;
        }
      }
    }
    uVar1 = *(uint *)&pObj->field_0x8 & 0xf;
    if (((uVar1 != 1) && (uVar1 != 4)) && (pObj->Id != 0)) {
      if (2 < uVar1 - 5) {
        __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                      ,0x14f,"int Ivy_ManIsAcyclic_rec(Ivy_Man_t *, Ivy_Obj_t *)");
      }
      iVar2 = Ivy_ManIsAcyclic_rec(p,(Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      if ((iVar2 == 0) ||
         ((0xfffffffd < (*(uint *)&pObj->field_0x8 & 0xf) - 7 &&
          (iVar2 = Ivy_ManIsAcyclic_rec(p,(Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe)),
          iVar2 == 0)))) {
        uVar1 = pObj->Id;
        __format = " -> %d";
        goto LAB_00642314;
      }
    }
    pObj->TravId = p->nTravIds + -1;
  }
  return iVar3;
}

Assistant:

int Ivy_ManIsAcyclic_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    // skip the node if it is already visited
    if ( Ivy_ObjIsTravIdPrevious(p, pObj) )
        return 1;
    // check if the node is part of the combinational loop
    if ( Ivy_ObjIsTravIdCurrent(p, pObj) )
    {
        fprintf( stdout, "Manager contains combinational loop!\n" );
        fprintf( stdout, "Node \"%d\" is encountered twice on the following path:\n",  Ivy_ObjId(pObj) );
        fprintf( stdout, " %d",  Ivy_ObjId(pObj) );
        return 0;
    }
    // mark this node as a node on the current path
    Ivy_ObjSetTravIdCurrent( p, pObj );
    // explore equivalent nodes if pObj is the main node
    if ( p->pHaig == NULL && pObj->pEquiv && Ivy_ObjRefs(pObj) > 0 )
    {
        Ivy_Obj_t * pTemp;
        assert( !Ivy_IsComplement(pObj->pEquiv) );
        for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
        {
            // traverse the fanin's cone searching for the loop
            if ( !Ivy_ManIsAcyclic_rec(p, pTemp) )
            {
                // return as soon as the loop is detected
                fprintf( stdout, " -> (%d", Ivy_ObjId(pObj) );
                for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
                    fprintf( stdout, " %d", Ivy_ObjId(pTemp) );
                fprintf( stdout, ")" );
                return 0; 
            }
        }
    }
    // quite if it is a CI node
    if ( Ivy_ObjIsCi(pObj) || Ivy_ObjIsConst1(pObj) )
    {
        // mark this node as a visited node
        Ivy_ObjSetTravIdPrevious( p, pObj );
        return 1;
    }
    assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj) );
    // traverse the fanin's cone searching for the loop
    if ( !Ivy_ManIsAcyclic_rec(p, Ivy_ObjFanin0(pObj)) )
    {
        // return as soon as the loop is detected
        fprintf( stdout, " -> %d", Ivy_ObjId(pObj) );
        return 0;
    }
    // traverse the fanin's cone searching for the loop
    if ( Ivy_ObjIsNode(pObj) && !Ivy_ManIsAcyclic_rec(p, Ivy_ObjFanin1(pObj)) )
    {
        // return as soon as the loop is detected
        fprintf( stdout, " -> %d", Ivy_ObjId(pObj) );
        return 0;
    }
    // mark this node as a visited node
    Ivy_ObjSetTravIdPrevious( p, pObj );
    return 1;
}